

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
pod_vector<IsoSpec::ProbAndConfPtr>::fast_reserve
          (pod_vector<IsoSpec::ProbAndConfPtr> *this,size_t n)

{
  ProbAndConfPtr *pPVar1;
  ProbAndConfPtr *__ptr;
  ProbAndConfPtr *pPVar2;
  undefined8 *puVar3;
  
  pPVar1 = this->first_free;
  __ptr = this->store;
  pPVar2 = (ProbAndConfPtr *)realloc(__ptr,n * 0x10);
  if (pPVar2 != (ProbAndConfPtr *)0x0) {
    this->first_free = (ProbAndConfPtr *)(((long)pPVar1 - (long)__ptr) + (long)pPVar2);
    this->backend_past_end = pPVar2 + n;
    this->store = pPVar2;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = operator_new;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void fast_reserve(size_t n)
    {
        ISOSPEC_IMPOSSIBLE(n < static_cast<size_t>(backend_past_end - store));
        const std::ptrdiff_t store_used_size = first_free - store;
        T* new_store = reinterpret_cast<T*>(realloc(store, n * sizeof(T)));
        if(new_store == NULL)
            throw std::bad_alloc();
        first_free = new_store + store_used_size;
        backend_past_end = new_store + n;
        store = new_store;
    }